

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmUnexpectedCommand.cxx
# Opt level: O1

bool __thiscall
cmUnexpectedCommand::InitialPass
          (cmUnexpectedCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *param_1,cmExecutionStatus *param_2)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmMakefile *this_00;
  int iVar2;
  char *__nptr;
  bool bVar3;
  double dVar4;
  allocator local_41;
  string local_40;
  
  this_00 = (this->super_cmCommand).Makefile;
  paVar1 = &local_40.field_2;
  local_40._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"CMAKE_MINIMUM_REQUIRED_VERSION","");
  __nptr = cmMakefile::GetDefinition(this_00,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  iVar2 = std::__cxx11::string::compare((char *)&this->Name);
  if ((iVar2 != 0) || ((bVar3 = true, __nptr != (char *)0x0 && (dVar4 = atof(__nptr), 1.4 < dVar4)))
     ) {
    std::__cxx11::string::string((string *)&local_40,this->Error,&local_41);
    cmCommand::SetError(&this->super_cmCommand,&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != paVar1) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool cmUnexpectedCommand::InitialPass(std::vector<std::string> const&,
                                      cmExecutionStatus&)
{
  const char* versionValue =
    this->Makefile->GetDefinition("CMAKE_MINIMUM_REQUIRED_VERSION");
  if (this->Name == "endif" && (!versionValue || atof(versionValue) <= 1.4)) {
    return true;
  }

  this->SetError(this->Error);
  return false;
}